

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avilib.cpp
# Opt level: O0

bool avilib::cancel(int32_t nom,int32_t denom,int32_t *out_nom,int32_t *out_denom)

{
  int32_t iVar1;
  int32_t _gcd;
  int32_t *out_denom_local;
  int32_t *out_nom_local;
  int32_t denom_local;
  int32_t nom_local;
  
  if ((denom == 0) || (nom == 0)) {
    denom_local._3_1_ = false;
  }
  else {
    iVar1 = gcd(nom,denom);
    if (iVar1 == 0) {
      denom_local._3_1_ = false;
    }
    else {
      *out_nom = nom / iVar1;
      *out_denom = denom / iVar1;
      denom_local._3_1_ = true;
    }
  }
  return denom_local._3_1_;
}

Assistant:

bool avilib::cancel( int32_t nom, int32_t denom, int32_t &out_nom, int32_t &out_denom )
{
	if( !denom || !nom ) return false;
	int32_t _gcd = gcd( nom, denom );

	if( _gcd ) {
		out_nom = nom / _gcd;
		out_denom = denom / _gcd;
		return true;
	}

	return false;
}